

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall QMetaEnumBuilder::addKey(QMetaEnumBuilder *this,QByteArray *name,quint64 value)

{
  QMetaEnumBuilderPrivate *name_00;
  QMetaEnumBuilderPrivate *in_RDX;
  QMetaEnumBuilder *in_RDI;
  QMetaEnumBuilderPrivate *d;
  undefined1 in_stack_ffffffffffffffcf;
  QMetaEnumBuilder *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  name_00 = d_func(in_stack_ffffffffffffffd8);
  if (name_00 == (QMetaEnumBuilderPrivate *)0x0) {
    local_4 = -1;
  }
  else {
    setIs64Bit(in_RDI,(bool)in_stack_ffffffffffffffcf);
    local_4 = QMetaEnumBuilderPrivate::addKey(in_RDX,&name_00->name,(quint64)in_RDI);
  }
  return local_4;
}

Assistant:

int QMetaEnumBuilder::addKey(const QByteArray &name, quint64 value)
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d) {
        setIs64Bit(true);
        return d->addKey(name, value);
    }
    return -1;
}